

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.h
# Opt level: O0

void store_coefficients(__m128i coeff_vals,tran_low_t *coeff_ptr)

{
  undefined1 auVar1 [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar2 [16];
  __m128i coeff_vals_2;
  __m128i coeff_vals_1;
  __m128i coeff_vals_lo;
  __m128i coeff_vals_hi;
  __m128i one;
  tran_low_t *coeff_ptr_local;
  __m128i coeff_vals_local;
  
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar2._8_8_ = 0x1000100010001;
  auVar2._0_8_ = 0x1000100010001;
  auVar2 = pmulhw(auVar1,auVar2);
  coeff_vals_lo[1]._0_2_ = (undefined2)in_XMM0_Qa;
  coeff_vals_lo[1]._2_2_ = (undefined2)((ulong)in_XMM0_Qa >> 0x10);
  coeff_vals_lo[1]._4_2_ = (undefined2)((ulong)in_XMM0_Qa >> 0x20);
  coeff_vals_lo[1]._6_2_ = (undefined2)((ulong)in_XMM0_Qa >> 0x30);
  coeff_vals_hi[0]._0_2_ = (undefined2)in_XMM0_Qb;
  coeff_vals_hi[0]._2_2_ = (undefined2)((ulong)in_XMM0_Qb >> 0x10);
  coeff_vals_hi[0]._4_2_ = (undefined2)((ulong)in_XMM0_Qb >> 0x20);
  coeff_vals_hi[0]._6_2_ = (undefined2)((ulong)in_XMM0_Qb >> 0x30);
  coeff_vals_hi[1]._0_2_ = auVar2._0_2_;
  coeff_vals_hi[1]._2_2_ = auVar2._2_2_;
  coeff_vals_hi[1]._4_2_ = auVar2._4_2_;
  coeff_vals_hi[1]._6_2_ = auVar2._6_2_;
  coeff_vals_local[0]._0_2_ = auVar2._8_2_;
  coeff_vals_local[0]._2_2_ = auVar2._10_2_;
  coeff_vals_local[0]._4_2_ = auVar2._12_2_;
  coeff_vals_local[0]._6_2_ = auVar2._14_2_;
  *(ulong *)coeff_vals[0] =
       CONCAT26(coeff_vals_hi[1]._2_2_,
                CONCAT24(coeff_vals_lo[1]._2_2_,
                         CONCAT22((undefined2)coeff_vals_hi[1],(undefined2)coeff_vals_lo[1])));
  *(ulong *)(coeff_vals[0] + 8) =
       CONCAT26(coeff_vals_hi[1]._6_2_,
                CONCAT24(coeff_vals_lo[1]._6_2_,
                         CONCAT22(coeff_vals_hi[1]._4_2_,coeff_vals_lo[1]._4_2_)));
  *(ulong *)(coeff_vals[0] + 0x10) =
       CONCAT26(coeff_vals_local[0]._2_2_,
                CONCAT24(coeff_vals_hi[0]._2_2_,
                         CONCAT22((undefined2)coeff_vals_local[0],(undefined2)coeff_vals_hi[0])));
  *(ulong *)(coeff_vals[0] + 0x18) =
       CONCAT26(coeff_vals_local[0]._6_2_,
                CONCAT24(coeff_vals_hi[0]._6_2_,
                         CONCAT22(coeff_vals_local[0]._4_2_,coeff_vals_hi[0]._4_2_)));
  return;
}

Assistant:

static inline void store_coefficients(__m128i coeff_vals,
                                      tran_low_t *coeff_ptr) {
  assert(sizeof(tran_low_t) == 4);

  __m128i one = _mm_set1_epi16(1);
  __m128i coeff_vals_hi = _mm_mulhi_epi16(coeff_vals, one);
  __m128i coeff_vals_lo = _mm_mullo_epi16(coeff_vals, one);
  __m128i coeff_vals_1 = _mm_unpacklo_epi16(coeff_vals_lo, coeff_vals_hi);
  __m128i coeff_vals_2 = _mm_unpackhi_epi16(coeff_vals_lo, coeff_vals_hi);
  _mm_store_si128((__m128i *)(coeff_ptr), coeff_vals_1);
  _mm_store_si128((__m128i *)(coeff_ptr + 4), coeff_vals_2);
}